

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest_InvalidOperatingPointIndexErrorDetail_Test::TestBody
          (LevelTest_InvalidOperatingPointIndexErrorDetail_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t enc;
  aom_codec_iface_t *codec;
  aom_codec_ctx_t *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffa78;
  aom_codec_iface_t *in_stack_fffffffffffffa80;
  allocator *paVar2;
  char *in_stack_fffffffffffffa88;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffa90;
  aom_codec_iface_t *in_stack_fffffffffffffa98;
  Type TVar3;
  aom_codec_ctx_t *in_stack_fffffffffffffaa0;
  AssertionResult local_530;
  Message *in_stack_fffffffffffffae8;
  AssertHelper *in_stack_fffffffffffffaf0;
  string local_508 [32];
  char *local_4e8;
  AssertionResult local_4e0;
  AssertionResult local_4b8 [2];
  allocator local_491;
  string local_490 [32];
  char *local_470;
  AssertionResult local_468 [2];
  undefined4 local_448;
  aom_codec_err_t local_444;
  AssertionResult local_440 [2];
  undefined4 local_420;
  aom_codec_err_t local_41c;
  AssertionResult local_418 [3];
  undefined4 local_3e8;
  aom_codec_err_t local_3e4;
  AssertionResult local_3e0 [57];
  aom_codec_ctx_t local_48;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_3e4 = aom_codec_enc_config_default
                        (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         (uint)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  local_3e8 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             &in_stack_fffffffffffffa78->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x8adf34);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,
               (Type)((ulong)in_stack_fffffffffffffa98 >> 0x20),(char *)in_stack_fffffffffffffa90,
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x8adf91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae002);
  local_41c = aom_codec_enc_init_ver
                        (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         in_stack_fffffffffffffa90,(aom_codec_flags_t)in_stack_fffffffffffffa88,
                         (int)((ulong)in_stack_fffffffffffffa80 >> 0x20));
  TVar3 = (Type)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  local_420 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             &in_stack_fffffffffffffa78->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x8ae0ac);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,TVar3,(char *)in_stack_fffffffffffffa90,
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x8ae109);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae177);
  local_444 = aom_codec_control(&local_48,0x36,0xc93);
  local_448 = 8;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             &in_stack_fffffffffffffa78->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffaa0 =
         (aom_codec_ctx_t *)testing::AssertionResult::failure_message((AssertionResult *)0x8ae213);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,TVar3,(char *)in_stack_fffffffffffffa90,
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x8ae270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae2e1);
  local_470 = aom_codec_error_detail(&local_48);
  paVar2 = &local_491;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"Invalid operating point index: 32",paVar2);
  TVar3 = (Type)((ulong)paVar2 >> 0x20);
  testing::internal::EqHelper::
  Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (char **)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_468);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa90 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x8ae3f9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,TVar3,(char *)in_stack_fffffffffffffa90,
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x8ae456);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae4c4);
  aom_codec_set_option
            ((aom_codec_ctx_t *)in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
             (char *)in_stack_fffffffffffffa68);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             &in_stack_fffffffffffffa78->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa88 =
         testing::AssertionResult::failure_message((AssertionResult *)0x8ae562);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,TVar3,(char *)in_stack_fffffffffffffa90,
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x8ae5bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae630);
  local_4e8 = aom_codec_error_detail(&local_48);
  paVar2 = (allocator *)&stack0xfffffffffffffaf7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"Invalid operating point index: 33",paVar2);
  testing::internal::EqHelper::
  Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (in_stack_fffffffffffffa88,(char *)paVar2,(char **)in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffaf7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa78 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x8ae748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,TVar3,(char *)in_stack_fffffffffffffa90,
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)paVar2);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x8ae79c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae807);
  aom_codec_destroy(in_stack_fffffffffffffa68);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffa88,(char *)paVar2,&in_stack_fffffffffffffa78->g_usage,
             (aom_codec_err_t *)in_stack_fffffffffffffa70);
  line = (int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_530);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x8ae87f)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,TVar3,(char *)in_stack_fffffffffffffa90,
               line,(char *)paVar2);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x8ae8cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ae92f);
  return;
}

Assistant:

TEST(LevelTest, InvalidOperatingPointIndexErrorDetail) {
  aom_codec_iface_t *codec = aom_codec_av1_cx();
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(aom_codec_enc_config_default(codec, &cfg, 0), AOM_CODEC_OK);
  EXPECT_EQ(aom_codec_enc_init(&enc, codec, &cfg, 0), AOM_CODEC_OK);
  EXPECT_EQ(aom_codec_control(&enc, AV1E_SET_TARGET_SEQ_LEVEL_IDX, 3219),
            AOM_CODEC_INVALID_PARAM);
  EXPECT_EQ(aom_codec_error_detail(&enc),
            std::string("Invalid operating point index: 32"));
  EXPECT_EQ(aom_codec_set_option(&enc, "target-seq-level-idx", "3319"),
            AOM_CODEC_INVALID_PARAM);
  EXPECT_EQ(aom_codec_error_detail(&enc),
            std::string("Invalid operating point index: 33"));
  EXPECT_EQ(aom_codec_destroy(&enc), AOM_CODEC_OK);
}